

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifUtil.c
# Opt level: O3

void If_CutTraverse(If_Man_t *p,If_Obj_t *pRoot,If_Cut_t *pCut,Vec_Ptr_t *vNodes)

{
  float fVar1;
  uint uVar2;
  int iVar3;
  uint *puVar4;
  void **ppvVar5;
  long lVar6;
  ulong uVar7;
  
  vNodes->nSize = 0;
  if (0xffffff < *(uint *)&pCut->field_0x1c) {
    uVar7 = 0;
    do {
      fVar1 = (&pCut[1].Area)[uVar7];
      if (((long)(int)fVar1 < 0) || (p->vObjs->nSize <= (int)fVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      puVar4 = (uint *)p->vObjs->pArray[(int)fVar1];
      if (puVar4 == (uint *)0x0) break;
      uVar2 = vNodes->nSize;
      if (uVar2 == vNodes->nCap) {
        if ((int)uVar2 < 0x10) {
          if (vNodes->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(vNodes->pArray,0x80);
          }
          vNodes->pArray = ppvVar5;
          vNodes->nCap = 0x10;
        }
        else {
          if (vNodes->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
          }
          else {
            ppvVar5 = (void **)realloc(vNodes->pArray,(ulong)uVar2 << 4);
          }
          vNodes->pArray = ppvVar5;
          vNodes->nCap = uVar2 * 2;
        }
      }
      else {
        ppvVar5 = vNodes->pArray;
      }
      iVar3 = vNodes->nSize;
      vNodes->nSize = iVar3 + 1;
      ppvVar5[iVar3] = puVar4;
      if ((*puVar4 >> 8 & 1) != 0) {
        __assert_fail("pLeaf->fMark == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifUtil.c"
                      ,0x23e,"void If_CutTraverse(If_Man_t *, If_Obj_t *, If_Cut_t *, Vec_Ptr_t *)")
        ;
      }
      *puVar4 = *puVar4 | 0x100;
      uVar7 = uVar7 + 1;
    } while (uVar7 < (byte)pCut->field_0x1f);
  }
  If_CutTraverse_rec(pRoot,vNodes);
  if (0 < vNodes->nSize) {
    lVar6 = 0;
    do {
      *(uint *)vNodes->pArray[lVar6] = *vNodes->pArray[lVar6] & 0xfffffeff;
      lVar6 = lVar6 + 1;
    } while (lVar6 < vNodes->nSize);
  }
  return;
}

Assistant:

void If_CutTraverse( If_Man_t * p, If_Obj_t * pRoot, If_Cut_t * pCut, Vec_Ptr_t * vNodes )
{
    If_Obj_t * pLeaf;
    int i;
    // collect the internal nodes of the cut
    Vec_PtrClear( vNodes );
    If_CutForEachLeaf( p, pCut, pLeaf, i )
    {
        Vec_PtrPush( vNodes, pLeaf );
        assert( pLeaf->fMark == 0 );
        pLeaf->fMark = 1;
    }
    // collect other nodes
    If_CutTraverse_rec( pRoot, vNodes );
    // clean the mark
    Vec_PtrForEachEntry( If_Obj_t *, vNodes, pLeaf, i )
        pLeaf->fMark = 0;
}